

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O3

void * xmlMemRealloc(void *ptr,size_t size)

{
  long lVar1;
  void *pvVar2;
  undefined4 *puVar3;
  
  if (ptr == (void *)0x0) {
    pvVar2 = xmlMemMalloc(size);
    return pvVar2;
  }
  xmlInitParser();
  if (size < 0xfffffffffffffff0) {
    if (*(int *)((long)ptr + -0x10) != 0x5aa5) {
      xmlPrintErrorMessage("xmlMemRealloc: Tag error\n");
      return (void *)0x0;
    }
    lVar1 = *(long *)((long)ptr + -8);
    *(undefined4 *)((long)ptr + -0x10) = 0xffffa55a;
    puVar3 = (undefined4 *)realloc((undefined4 *)((long)ptr + -0x10),size + 0x10);
    if (puVar3 != (undefined4 *)0x0) {
      *puVar3 = 0x5aa5;
      *(size_t *)(puVar3 + 2) = size;
      xmlMutexLock(&xmlMemMutex);
      debugMemSize = debugMemSize + (size - lVar1);
      xmlMutexUnlock(&xmlMemMutex);
      return puVar3 + 4;
    }
    *(undefined4 *)((long)ptr + -0x10) = 0x5aa5;
  }
  return (void *)0x0;
}

Assistant:

void *
xmlMemRealloc(void *ptr, size_t size) {
    MEMHDR *p, *tmp;
    size_t oldSize;

    if (ptr == NULL)
        return(xmlMemMalloc(size));

    xmlInitParser();

    if (size > (MAX_SIZE_T - RESERVE_SIZE))
        return(NULL);

    p = CLIENT_2_HDR(ptr);
    if (p->mh_tag != MEMTAG) {
        xmlPrintErrorMessage("xmlMemRealloc: Tag error\n");
        return(NULL);
    }
    oldSize = p->mh_size;
    p->mh_tag = ~MEMTAG;

    tmp = (MEMHDR *) realloc(p, RESERVE_SIZE + size);
    if (!tmp) {
        p->mh_tag = MEMTAG;
        return(NULL);
    }
    p = tmp;
    p->mh_tag = MEMTAG;
    p->mh_size = size;

    xmlMutexLock(&xmlMemMutex);
    debugMemSize -= oldSize;
    debugMemSize += size;
    xmlMutexUnlock(&xmlMemMutex);

    return(HDR_2_CLIENT(p));
}